

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O2

int __thiscall
cmCTestBuildHandler::RunMakeCommand
          (cmCTestBuildHandler *this,string *command,int *retVal,char *dir,int timeout,ostream *ofs,
          Encoding encoding)

{
  t_BuildProcessingQueueType *this_00;
  t_ErrorsAndWarningsVector *this_01;
  t_BuildProcessingQueueType *queue;
  cmCTest *pcVar1;
  pointer ppcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  cmsysProcess *cp;
  t_BuildProcessingQueueType *queue_00;
  unsigned_long uVar7;
  size_t sVar8;
  long lVar9;
  size_t length_00;
  pointer ppcVar10;
  char *pcVar11;
  cmCTestBuildErrorWarning *this_02;
  unsigned_long i;
  unsigned_long dindex;
  string *arg;
  string_view str;
  cmProcessOutput processOutput;
  size_type tick;
  int length;
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  string strdata;
  char *data;
  cmCTestBuildErrorWarning errorwarning;
  Directory launchDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  LaunchHelper launchHelper;
  string local_2c0;
  string local_2a0;
  string local_280;
  ostringstream cmCTestLog_msg;
  undefined4 uStack_25c;
  _Alloc_hider local_258;
  undefined1 local_250 [24];
  _Alloc_hider local_238;
  undefined1 local_230 [24];
  _Alloc_hider local_218;
  undefined1 local_210 [24];
  int local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0 [6];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_160 [2];
  cmsysProcess *local_120;
  int local_118;
  string local_f0 [192];
  
  cmSystemTools::ParseArguments(&args,command);
  if (args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar4 = 0;
    goto LAB_0045788e;
  }
  argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
            (&argv,((long)args.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)args.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
  for (; args.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         args.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
      args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           args.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 1) {
    _cmCTestLog_msg =
         ((args.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&cmCTestLog_msg);
  }
  _cmCTestLog_msg = (pointer)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&cmCTestLog_msg);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  std::operator<<((ostream *)&cmCTestLog_msg,"Run command:");
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
               ,0x311,(char *)errorwarning._0_8_,(this->super_cmCTestGenericHandler).Quiet);
  std::__cxx11::string::~string((string *)&errorwarning);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  ppcVar2 = argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppcVar10 = argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      (ppcVar10 != ppcVar2 && (pcVar11 = *ppcVar10, pcVar11 != (char *)0x0));
      ppcVar10 = ppcVar10 + 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar6 = std::operator<<((ostream *)&cmCTestLog_msg," \"");
    poVar6 = std::operator<<(poVar6,pcVar11);
    std::operator<<(poVar6,"\"");
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                 ,0x317,(char *)errorwarning._0_8_,(this->super_cmCTestGenericHandler).Quiet);
    std::__cxx11::string::~string((string *)&errorwarning);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  std::endl<char,std::char_traits<char>>((ostream *)&cmCTestLog_msg);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
               ,0x31a,(char *)errorwarning._0_8_,(this->super_cmCTestGenericHandler).Quiet);
  std::__cxx11::string::~string((string *)&errorwarning);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  LaunchHelper::LaunchHelper(&launchHelper,this);
  cp = cmsysProcess_New();
  cmsysProcess_SetCommand
            (cp,argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start);
  cmsysProcess_SetWorkingDirectory(cp,dir);
  cmsysProcess_SetOption(cp,0,1);
  cmsysProcess_SetTimeout(cp,(double)timeout);
  cmsysProcess_Execute(cp);
  tick = 0;
  cmProcessOutput::cmProcessOutput(&processOutput,encoding,0x400);
  strdata._M_dataplus._M_p = (pointer)&strdata.field_2;
  strdata._M_string_length = 0;
  strdata.field_2._M_local_buf[0] = '\0';
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"   Each symbol represents ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6," bytes of output.");
  poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
  pcVar11 = "   \'!\' represents an error and \'*\' a warning.\n";
  if (this->UseCTestLaunch != false) {
    pcVar11 = "";
  }
  poVar6 = std::operator<<(poVar6,pcVar11);
  std::operator<<(poVar6,"    ");
  std::ostream::flush();
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
               ,0x338,(char *)errorwarning._0_8_,(this->super_cmCTestGenericHandler).Quiet);
  std::__cxx11::string::~string((string *)&errorwarning);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  this_00 = &this->BuildProcessingQueue;
  std::deque<char,_std::allocator<char>_>::clear(this_00);
  this->OutputLineCounter = 0;
  this_01 = &this->ErrorsAndWarnings;
  std::
  vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
  ::clear(this_01);
  this->TotalErrors = 0;
  this->TotalWarnings = 0;
  this->BuildOutputLogSize = 0;
  this->LastTickChar = '.';
  this->ErrorQuotaReached = false;
  this->WarningQuotaReached = false;
  queue = &this->BuildProcessingErrorQueue;
  while (iVar4 = cmsysProcess_WaitForData(cp,&data,&length,(double *)0x0), iVar4 != 0) {
    for (lVar9 = 0; length_00 = (size_t)length, lVar9 < (long)length_00; lVar9 = lVar9 + 1) {
      if (data[lVar9] == '\0') {
        data[lVar9] = '\n';
      }
    }
    if (iVar4 == 3) {
      cmProcessOutput::DecodeText(&processOutput,data,length_00,&strdata,1);
      queue_00 = queue;
    }
    else {
      cmProcessOutput::DecodeText(&processOutput,data,length_00,&strdata,2);
      queue_00 = this_00;
    }
    ProcessBuffer(this,strdata._M_dataplus._M_p,strdata._M_string_length,&tick,0x400,ofs,queue_00);
  }
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  local_280._M_string_length = 0;
  local_280.field_2._M_local_buf[0] = '\0';
  cmProcessOutput::DecodeText(&processOutput,&local_280,&strdata,1);
  std::__cxx11::string::~string((string *)&local_280);
  if (strdata._M_string_length != 0) {
    ProcessBuffer(this,strdata._M_dataplus._M_p,strdata._M_string_length,&tick,0x400,ofs,queue);
  }
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  local_2a0._M_string_length = 0;
  local_2a0.field_2._M_local_buf[0] = '\0';
  cmProcessOutput::DecodeText(&processOutput,&local_2a0,&strdata,2);
  std::__cxx11::string::~string((string *)&local_2a0);
  if (strdata._M_string_length != 0) {
    ProcessBuffer(this,strdata._M_dataplus._M_p,strdata._M_string_length,&tick,0x400,ofs,this_00);
  }
  ProcessBuffer(this,(char *)0x0,0,&tick,0x400,ofs,this_00);
  ProcessBuffer(this,(char *)0x0,0,&tick,0x400,ofs,queue);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar6 = std::operator<<((ostream *)&cmCTestLog_msg," Size of output: ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6,"K");
  std::endl<char,std::char_traits<char>>(poVar6);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
               ,0x36e,(char *)errorwarning._0_8_,(this->super_cmCTestGenericHandler).Quiet);
  std::__cxx11::string::~string((string *)&errorwarning);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  cmsysProcess_WaitForExit(cp,(double *)0x0);
  iVar4 = cmsysProcess_GetState(cp);
  switch(iVar4) {
  case 1:
    errorwarning.Text._M_dataplus._M_p = (pointer)&errorwarning.Text.field_2;
    errorwarning.Text._M_string_length = 0;
    errorwarning.Text.field_2._M_local_buf[0] = '\0';
    errorwarning.SourceFile._M_dataplus._M_p = (pointer)&errorwarning.SourceFile.field_2;
    errorwarning.SourceFile._M_string_length = 0;
    errorwarning.SourceFile.field_2._M_local_buf[0] = '\0';
    errorwarning.SourceFileTail._M_dataplus._M_p = (pointer)&errorwarning.SourceFileTail.field_2;
    errorwarning.SourceFileTail._M_string_length = 0;
    errorwarning.SourceFileTail.field_2._M_local_buf[0] = '\0';
    errorwarning.PreContext._M_dataplus._M_p = (pointer)&errorwarning.PreContext.field_2;
    errorwarning.PreContext._M_string_length = 0;
    errorwarning.PreContext.field_2._M_local_buf[0] = '\0';
    errorwarning.PostContext._M_dataplus._M_p = (pointer)&errorwarning.PostContext.field_2;
    errorwarning.PostContext._M_string_length = 0;
    errorwarning.PostContext.field_2._M_local_buf[0] = '\0';
    errorwarning.LineNumber = 0;
    errorwarning.LogLine = 1;
    _cmCTestLog_msg = (pointer)0x15;
    local_258._M_p = "*** ERROR executing: ";
    pcVar11 = cmsysProcess_GetErrorString(cp);
    launchDir.Internal = (DirectoryInternals *)strlen(pcVar11);
    cmStrCat<>(&local_2c0,(cmAlphaNum *)&cmCTestLog_msg,(cmAlphaNum *)&launchDir);
    std::__cxx11::string::operator=((string *)&errorwarning.Text,(string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    errorwarning.PreContext._M_string_length = 0;
    *errorwarning.PreContext._M_dataplus._M_p = '\0';
    errorwarning.PostContext._M_string_length = 0;
    *errorwarning.PostContext._M_dataplus._M_p = '\0';
    errorwarning.Error = true;
    std::
    vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
    ::emplace_back<cmCTestBuildHandler::cmCTestBuildErrorWarning>(this_01,&errorwarning);
    this->TotalErrors = this->TotalErrors + 1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"There was an error: ");
    pcVar11 = cmsysProcess_GetErrorString(cp);
    poVar6 = std::operator<<(poVar6,pcVar11);
    std::endl<char,std::char_traits<char>>(poVar6);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                 ,0x3bf,(char *)launchDir.Internal,false);
    std::__cxx11::string::~string((string *)&launchDir);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    this_02 = &errorwarning;
LAB_004575e5:
    cmCTestBuildErrorWarning::~cmCTestBuildErrorWarning(this_02);
    break;
  case 2:
    if (retVal != (int *)0x0) {
      iVar5 = cmsysProcess_GetExitException(cp);
      *retVal = iVar5;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"There was an exception: ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,*retVal);
      std::endl<char,std::char_traits<char>>(poVar6);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                   ,0x3ac,(char *)errorwarning._0_8_,(this->super_cmCTestGenericHandler).Quiet);
      goto LAB_0045784b;
    }
    break;
  case 4:
    if (retVal != (int *)0x0) {
      iVar5 = cmsysProcess_GetExitValue(cp);
      *retVal = iVar5;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"Command exited with the value: ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,*retVal);
      std::endl<char,std::char_traits<char>>(poVar6);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                   ,0x37a,(char *)errorwarning._0_8_,(this->super_cmCTestGenericHandler).Quiet);
      std::__cxx11::string::~string((string *)&errorwarning);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      if (*retVal != 0) {
        if (this->UseCTestLaunch != true) {
          local_258._M_p = local_250 + 8;
          local_250._0_8_ = 0;
          local_250[8] = '\0';
          local_238._M_p = local_230 + 8;
          local_230._0_8_ = 0;
          local_230[8] = '\0';
          local_218._M_p = local_210 + 8;
          local_210._0_8_ = 0;
          local_210[8] = '\0';
          local_1f0._M_allocated_capacity = (size_type)&local_1e0;
          local_1f0._8_8_ = 0;
          local_1e0._M_local_buf[0] = '\0';
          local_1d0._M_allocated_capacity = (size_type)local_1c0;
          local_1d0._8_8_ = 0;
          local_1c0[0]._M_local_buf[0] = '\0';
          local_1f8 = 0;
          uStack_25c = 1;
          errorwarning.Error = true;
          errorwarning._1_3_ = 0;
          errorwarning.LogLine = 0;
          errorwarning.Text._M_dataplus._M_p = "*** WARNING non-zero return value in ctest from: ";
          launchDir.Internal =
               (DirectoryInternals *)
               strlen(*argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                       super__Vector_impl_data._M_start);
          cmStrCat<>(&local_2c0,(cmAlphaNum *)&errorwarning,(cmAlphaNum *)&launchDir);
          std::__cxx11::string::operator=((string *)&local_258,(string *)&local_2c0);
          std::__cxx11::string::~string((string *)&local_2c0);
          local_1f0._8_8_ = 0;
          *(char *)local_1f0._M_allocated_capacity = '\0';
          local_1d0._8_8_ = 0;
          *(char *)local_1d0._M_allocated_capacity = '\0';
          _cmCTestLog_msg = _cmCTestLog_msg & 0xffffffffffffff00;
          std::
          vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
          ::emplace_back<cmCTestBuildHandler::cmCTestBuildErrorWarning>
                    (this_01,(cmCTestBuildErrorWarning *)&cmCTestLog_msg);
          this->TotalWarnings = this->TotalWarnings + 1;
          this_02 = (cmCTestBuildErrorWarning *)&cmCTestLog_msg;
          goto LAB_004575e5;
        }
        cmsys::Directory::Directory(&launchDir);
        cmsys::Directory::Load(&launchDir,&this->CTestLaunchDir,(string *)0x0);
        uVar7 = cmsys::Directory::GetNumberOfFiles(&launchDir);
        dindex = 0;
        do {
          if (uVar7 == dindex) {
            cmCTestLaunchReporter::cmCTestLaunchReporter((cmCTestLaunchReporter *)&cmCTestLog_msg);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator=(local_160,&args);
            cmCTestLaunchReporter::ComputeFileNames((cmCTestLaunchReporter *)&cmCTestLog_msg);
            local_118 = *retVal;
            local_120 = cp;
            std::ostream::flush();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&errorwarning,"Build",(allocator<char> *)&local_2c0);
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&(this->super_cmCTestGenericHandler).LogFileNames,(key_type *)&errorwarning
                        );
            std::__cxx11::string::_M_assign(local_f0);
            std::__cxx11::string::~string((string *)&errorwarning);
            std::__cxx11::string::append((char *)local_f0);
            cmCTestLaunchReporter::WriteXML((cmCTestLaunchReporter *)&cmCTestLog_msg);
            cmCTestLaunchReporter::~cmCTestLaunchReporter((cmCTestLaunchReporter *)&cmCTestLog_msg);
            break;
          }
          pcVar11 = cmsys::Directory::GetFile(&launchDir,dindex);
          sVar8 = strlen(pcVar11);
          str._M_str = pcVar11;
          str._M_len = sVar8;
          bVar3 = cmHasLiteralSuffix<5ul>(str,(char (*) [5])0x6933a3);
          dindex = dindex + 1;
        } while (!bVar3);
        cmsys::Directory::~Directory(&launchDir);
      }
    }
    break;
  case 5:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"There was a timeout");
    std::endl<char,std::char_traits<char>>(poVar6);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                 ,0x3b0,(char *)errorwarning._0_8_,(this->super_cmCTestGenericHandler).Quiet);
LAB_0045784b:
    std::__cxx11::string::~string((string *)&errorwarning);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  }
  cmsysProcess_Delete(cp);
  std::__cxx11::string::~string((string *)&strdata);
  LaunchHelper::~LaunchHelper(&launchHelper);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
LAB_0045788e:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&args);
  return iVar4;
}

Assistant:

int cmCTestBuildHandler::RunMakeCommand(const std::string& command,
                                        int* retVal, const char* dir,
                                        int timeout, std::ostream& ofs,
                                        Encoding encoding)
{
  // First generate the command and arguments
  std::vector<std::string> args = cmSystemTools::ParseArguments(command);

  if (args.empty()) {
    return false;
  }

  std::vector<const char*> argv;
  argv.reserve(args.size() + 1);
  for (std::string const& arg : args) {
    argv.push_back(arg.c_str());
  }
  argv.push_back(nullptr);

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Run command:", this->Quiet);
  for (char const* arg : argv) {
    if (!arg) {
      break;
    }
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       " \"" << arg << "\"", this->Quiet);
  }
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, std::endl,
                     this->Quiet);

  // Optionally use make rule launchers to record errors and warnings.
  LaunchHelper launchHelper(this);
  static_cast<void>(launchHelper);

  // Now create process object
  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, argv.data());
  cmsysProcess_SetWorkingDirectory(cp, dir);
  cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  cmsysProcess_SetTimeout(cp, timeout);
  cmsysProcess_Execute(cp);

  // Initialize tick's
  std::string::size_type tick = 0;
  const std::string::size_type tick_len = 1024;

  char* data;
  int length;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  cmCTestOptionalLog(
    this->CTest, HANDLER_PROGRESS_OUTPUT,
    "   Each symbol represents "
      << tick_len << " bytes of output." << std::endl
      << (this->UseCTestLaunch
            ? ""
            : "   '!' represents an error and '*' a warning.\n")
      << "    " << std::flush,
    this->Quiet);

  // Initialize building structures
  this->BuildProcessingQueue.clear();
  this->OutputLineCounter = 0;
  this->ErrorsAndWarnings.clear();
  this->TotalErrors = 0;
  this->TotalWarnings = 0;
  this->BuildOutputLogSize = 0;
  this->LastTickChar = '.';
  this->WarningQuotaReached = false;
  this->ErrorQuotaReached = false;

  // For every chunk of data
  int res;
  while ((res = cmsysProcess_WaitForData(cp, &data, &length, nullptr))) {
    // Replace '\0' with '\n', since '\0' does not really make sense. This is
    // for Visual Studio output
    for (int cc = 0; cc < length; ++cc) {
      if (data[cc] == 0) {
        data[cc] = '\n';
      }
    }

    // Process the chunk of data
    if (res == cmsysProcess_Pipe_STDERR) {
      processOutput.DecodeText(data, length, strdata, 1);
      this->ProcessBuffer(strdata.c_str(), strdata.size(), tick, tick_len, ofs,
                          &this->BuildProcessingErrorQueue);
    } else {
      processOutput.DecodeText(data, length, strdata, 2);
      this->ProcessBuffer(strdata.c_str(), strdata.size(), tick, tick_len, ofs,
                          &this->BuildProcessingQueue);
    }
  }
  processOutput.DecodeText(std::string(), strdata, 1);
  if (!strdata.empty()) {
    this->ProcessBuffer(strdata.c_str(), strdata.size(), tick, tick_len, ofs,
                        &this->BuildProcessingErrorQueue);
  }
  processOutput.DecodeText(std::string(), strdata, 2);
  if (!strdata.empty()) {
    this->ProcessBuffer(strdata.c_str(), strdata.size(), tick, tick_len, ofs,
                        &this->BuildProcessingQueue);
  }

  this->ProcessBuffer(nullptr, 0, tick, tick_len, ofs,
                      &this->BuildProcessingQueue);
  this->ProcessBuffer(nullptr, 0, tick, tick_len, ofs,
                      &this->BuildProcessingErrorQueue);
  cmCTestOptionalLog(this->CTest, HANDLER_PROGRESS_OUTPUT,
                     " Size of output: "
                       << ((this->BuildOutputLogSize + 512) / 1024) << "K"
                       << std::endl,
                     this->Quiet);

  // Properly handle output of the build command
  cmsysProcess_WaitForExit(cp, nullptr);
  int result = cmsysProcess_GetState(cp);

  if (result == cmsysProcess_State_Exited) {
    if (retVal) {
      *retVal = cmsysProcess_GetExitValue(cp);
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "Command exited with the value: " << *retVal
                                                           << std::endl,
                         this->Quiet);
      // if a non zero return value
      if (*retVal) {
        // If there was an error running command, report that on the
        // dashboard.
        if (this->UseCTestLaunch) {
          // For launchers, do not record this top-level error if other
          // more granular build errors have already been captured.
          bool launcherXMLFound = false;
          cmsys::Directory launchDir;
          launchDir.Load(this->CTestLaunchDir);
          unsigned long n = launchDir.GetNumberOfFiles();
          for (unsigned long i = 0; i < n; ++i) {
            const char* fname = launchDir.GetFile(i);
            if (cmHasLiteralSuffix(fname, ".xml")) {
              launcherXMLFound = true;
              break;
            }
          }
          if (!launcherXMLFound) {
            cmCTestLaunchReporter reporter;
            reporter.RealArgs = args;
            reporter.ComputeFileNames();
            reporter.ExitCode = *retVal;
            reporter.Process = cp;
            // Use temporary BuildLog file to populate this error for CDash.
            ofs.flush();
            reporter.LogOut = this->LogFileNames["Build"];
            reporter.LogOut += ".tmp";
            reporter.WriteXML();
          }
        } else {
          cmCTestBuildErrorWarning errorwarning;
          errorwarning.LineNumber = 0;
          errorwarning.LogLine = 1;
          errorwarning.Text = cmStrCat(
            "*** WARNING non-zero return value in ctest from: ", argv[0]);
          errorwarning.PreContext.clear();
          errorwarning.PostContext.clear();
          errorwarning.Error = false;
          this->ErrorsAndWarnings.push_back(std::move(errorwarning));
          this->TotalWarnings++;
        }
      }
    }
  } else if (result == cmsysProcess_State_Exception) {
    if (retVal) {
      *retVal = cmsysProcess_GetExitException(cp);
      cmCTestOptionalLog(this->CTest, WARNING,
                         "There was an exception: " << *retVal << std::endl,
                         this->Quiet);
    }
  } else if (result == cmsysProcess_State_Expired) {
    cmCTestOptionalLog(this->CTest, WARNING,
                       "There was a timeout" << std::endl, this->Quiet);
  } else if (result == cmsysProcess_State_Error) {
    // If there was an error running command, report that on the dashboard.
    cmCTestBuildErrorWarning errorwarning;
    errorwarning.LineNumber = 0;
    errorwarning.LogLine = 1;
    errorwarning.Text =
      cmStrCat("*** ERROR executing: ", cmsysProcess_GetErrorString(cp));
    errorwarning.PreContext.clear();
    errorwarning.PostContext.clear();
    errorwarning.Error = true;
    this->ErrorsAndWarnings.push_back(std::move(errorwarning));
    this->TotalErrors++;
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "There was an error: " << cmsysProcess_GetErrorString(cp)
                                      << std::endl);
  }

  cmsysProcess_Delete(cp);
  return result;
}